

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

void Abc_FrameReplaceCexVec(Abc_Frame_t *pAbc,Vec_Ptr_t **pvCexVec)

{
  if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(pAbc->vCexVec);
  }
  pAbc->vCexVec = *pvCexVec;
  *pvCexVec = (Vec_Ptr_t *)0x0;
  if (pAbc->pCex != (Abc_Cex_t *)0x0) {
    free(pAbc->pCex);
    pAbc->pCex = (Abc_Cex_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCexVec( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvCexVec )
{
    // update CEX vector
    if ( pAbc->vCexVec )
        Vec_PtrFreeFree( pAbc->vCexVec );
    pAbc->vCexVec = *pvCexVec;
    *pvCexVec = NULL;
    // remove CEX
    ABC_FREE( pAbc->pCex );
}